

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O1

void decaf_ed25519_convert_private_key_to_x25519(uint8_t *x,uint8_t *ed)

{
  decaf_sha512_ctx_t ctx;
  decaf_sha512_ctx_s dStack_e8;
  
  decaf_sha512_init(&dStack_e8);
  decaf_sha512_update(&dStack_e8,ed,0x20);
  decaf_sha512_final(&dStack_e8,x,0x20);
  decaf_bzero(&dStack_e8,200);
  return;
}

Assistant:

void decaf_ed25519_convert_private_key_to_x25519 (
    uint8_t x[DECAF_X25519_PRIVATE_BYTES],
    const uint8_t ed[DECAF_EDDSA_25519_PRIVATE_BYTES]
) {
    /* pass the private key through hash_hash function */
    /* and keep the first DECAF_X25519_PRIVATE_BYTES bytes */
    hash_hash(
        x,
        DECAF_X25519_PRIVATE_BYTES,
        ed,
        DECAF_EDDSA_25519_PRIVATE_BYTES
    );
}